

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O3

Status __thiscall mognetwork::TcpSocket::readPendingDatas(TcpSocket *this)

{
  Status SVar1;
  int iVar2;
  ReadedDatas *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  LibNetworkException *this_01;
  
  if (this->m_protocolListener != (AProtocolListener *)0x0) {
    SVar1 = (*this->m_protocolListener->_vptr_AProtocolListener[2])();
    iVar2 = (*this->m_protocolListener->_vptr_AProtocolListener[3])();
    if ((char)iVar2 != '\0') {
      this_00 = (ReadedDatas *)operator_new(0x28);
      ReadedDatas::ReadedDatas(this_00);
      this->m_allDataReaded = this_00;
      iVar2 = (*this->m_protocolListener->_vptr_AProtocolListener[6])();
      std::vector<char,_std::allocator<char>_>::operator=
                (&this->m_allDataReaded->datas,
                 (vector<char,_std::allocator<char>_> *)(CONCAT44(extraout_var,iVar2) + 0x10));
      iVar2 = (*this->m_protocolListener->_vptr_AProtocolListener[6])();
      this->m_allDataReaded->readed = *(size_t *)CONCAT44(extraout_var_00,iVar2);
      iVar2 = (*this->m_protocolListener->_vptr_AProtocolListener[6])();
      this->m_allDataReaded->totalSize = *(uint32_t *)(CONCAT44(extraout_var_01,iVar2) + 8);
      (*this->m_protocolListener->_vptr_AProtocolListener[7])();
      SVar1 = Ok;
    }
    return SVar1;
  }
  this_01 = (LibNetworkException *)__cxa_allocate_exception(0x28);
  LibNetworkException::LibNetworkException
            (this_01,"No protocol listener found.",0xcb,
             "/workspace/llm4binary/github/license_c_cmakelists/AlexMog[P]LibNet/src/TcpSocket.cpp")
  ;
  __cxa_throw(this_01,&LibNetworkException::typeinfo,LibNetworkException::~LibNetworkException);
}

Assistant:

Socket::Status TcpSocket::readPendingDatas()
  {
    if (m_protocolListener == NULL)
      throw LibNetworkException("No protocol listener found.", __LINE__, __FILE__);

    Socket::Status status = m_protocolListener->onReadTrigger();

    if (m_protocolListener->datasFullyReceived())
      {
	m_allDataReaded = new ReadedDatas();
	m_allDataReaded->datas = m_protocolListener->getReadedDatas().datas;
	m_allDataReaded->readed = m_protocolListener->getReadedDatas().readed;
	m_allDataReaded->totalSize = m_protocolListener->getReadedDatas().totalSize;
	m_protocolListener->flushReader();
	return (Ok);
      }
    return status;
  }